

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O2

Time helics::fileops::loadJsonTime(json *timeElement,time_units defaultUnits)

{
  value_t vVar1;
  bool bVar2;
  const_reference pvVar3;
  long lVar4;
  TimeRepresentation<count_time<9,_long>_> TVar5;
  Time TVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  double dVar7;
  string_view unitString;
  string_view unitString_00;
  string_view timeString;
  size_t local_40;
  utilities *local_38;
  
  vVar1 = (timeElement->m_data).m_type;
  if (vVar1 == object) {
    bVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[5],_0>(timeElement,(char (*) [5])0x35fc34);
    if (bVar2) {
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)timeElement,"unit");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_40,pvVar3);
      unitString._M_str = extraout_RDX;
      unitString._M_len = local_40;
      defaultUnits = gmlc::utilities::timeUnitsFromString(local_38,unitString);
      std::__cxx11::string::~string((string *)&local_40);
    }
    bVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[6],_0>(timeElement,(char (*) [6])0x361836);
    if (bVar2) {
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)timeElement,"units");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_40,pvVar3);
      unitString_00._M_str = extraout_RDX_00;
      unitString_00._M_len = local_40;
      defaultUnits = gmlc::utilities::timeUnitsFromString(local_38,unitString_00);
      std::__cxx11::string::~string((string *)&local_40);
    }
    bVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[6],_0>(timeElement,(char (*) [6])0x35e5a9);
    if (bVar2) {
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)timeElement,"value");
      vVar1 = (pvVar3->m_data).m_type;
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)timeElement,"value");
      if ((byte)(vVar1 - number_integer) < 2) {
        lVar4 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::get_impl<long,_0>();
        TVar5.internalTimeCode = count_time<9,_long>::fromCount(lVar4,defaultUnits);
      }
      else {
        dVar7 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::get_impl<double,_0>(pvVar3);
        TVar5.internalTimeCode =
             count_time<9,_long>::convert(dVar7 * timeCountReverse[(int)defaultUnits]);
      }
    }
    else {
      TVar5.internalTimeCode = -0x7fffffffffffffff;
    }
  }
  else {
    if ((byte)(vVar1 - number_integer) < 2) {
      lVar4 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::get_impl<long,_0>(timeElement);
      TVar6.internalTimeCode = count_time<9,_long>::fromCount(lVar4,defaultUnits);
      return (Time)TVar6.internalTimeCode;
    }
    if (vVar1 == number_float) {
      dVar7 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::get_impl<double,_0>(timeElement);
      TVar6.internalTimeCode =
           count_time<9,_long>::convert(dVar7 * timeCountReverse[(int)defaultUnits]);
      return (Time)TVar6.internalTimeCode;
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_40,timeElement);
    timeString._M_str = extraout_RDX_01;
    timeString._M_len = local_40;
    TVar5 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                      (local_38,timeString);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (Time)TVar5.internalTimeCode;
}

Assistant:

helics::Time loadJsonTime(const nlohmann::json& timeElement, time_units defaultUnits)
{
    if (timeElement.is_object()) {
        if (timeElement.contains("unit")) {
            defaultUnits =
                gmlc::utilities::timeUnitsFromString(timeElement["unit"].get<std::string>());
        }
        if (timeElement.contains("units")) {
            defaultUnits =
                gmlc::utilities::timeUnitsFromString(timeElement["units"].get<std::string>());
        }
        if (timeElement.contains("value")) {
            if (timeElement["value"].is_number_integer()) {
                return {timeElement["value"].get<int64_t>(), defaultUnits};
            }
            return {timeElement["value"].get<double>() * toSecondMultiplier(defaultUnits)};
        }
        return helics::Time::minVal();
    }
    if (timeElement.is_number_integer() || timeElement.is_number_unsigned()) {
        return {timeElement.get<std::int64_t>(), defaultUnits};
    }
    if (timeElement.is_number_float()) {
        return {timeElement.get<double>() * toSecondMultiplier(defaultUnits)};
    }
    return gmlc::utilities::loadTimeFromString<helics::Time>(timeElement.get<std::string>());
}